

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O2

vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
* __thiscall
libtorrent::aux::read_endpoint_list<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
          (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           *__return_storage_ptr__,aux *this,bdecode_node *n)

{
  type_t tVar1;
  int iVar2;
  char **in_00;
  char **in_01;
  int i;
  char *in;
  bdecode_node e;
  char *local_98;
  bdecode_node local_90;
  basic_endpoint<boost::asio::ip::tcp> local_4c;
  
  (__return_storage_ptr__->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tVar1 = bdecode_node::type((bdecode_node *)this);
  if (tVar1 == list_t) {
    for (i = 0; iVar2 = bdecode_node::list_size((bdecode_node *)this), i < iVar2; i = i + 1) {
      bdecode_node::list_at(&local_90,(bdecode_node *)this,i);
      tVar1 = bdecode_node::type(&local_90);
      if (tVar1 != string_t) {
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&local_90);
        return __return_storage_ptr__;
      }
      iVar2 = bdecode_node::string_length(&local_90);
      if (5 < iVar2) {
        local_98 = bdecode_node::string_ptr(&local_90);
        iVar2 = bdecode_node::string_length(&local_90);
        if (iVar2 == 6) {
          read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                    (&local_4c,(aux *)&local_98,in_00);
          ::std::
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
          ::emplace_back<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                    ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                      *)__return_storage_ptr__,&local_4c);
        }
        else {
          iVar2 = bdecode_node::string_length(&local_90);
          if (iVar2 == 0x12) {
            read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                      (&local_4c,(aux *)&local_98,in_01);
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::emplace_back<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)__return_storage_ptr__,&local_4c);
          }
        }
      }
      ::std::
      _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       *)&local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<EndpointType> read_endpoint_list(libtorrent::bdecode_node const& n)
	{
		std::vector<EndpointType> ret;
		if (n.type() != bdecode_node::list_t) return ret;
		for (int i = 0; i < n.list_size(); ++i)
		{
			bdecode_node e = n.list_at(i);
			if (e.type() != bdecode_node::string_t) return ret;
			if (e.string_length() < 6) continue;
			char const* in = e.string_ptr();
			if (e.string_length() == 6)
				ret.push_back(read_v4_endpoint<EndpointType>(in));
			else if (e.string_length() == 18)
				ret.push_back(read_v6_endpoint<EndpointType>(in));
		}
		return ret;
	}